

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O0

void __thiscall
lunasvg::Canvas::drawImage
          (Canvas *this,Bitmap *image,Rect *dstRect,Rect *srcRect,Transform *transform)

{
  plutovg_canvas_t *ppVar1;
  plutovg_matrix_t *matrix_00;
  plutovg_surface_t *surface;
  undefined1 local_50 [8];
  plutovg_matrix_t matrix;
  float yScale;
  float xScale;
  Transform *transform_local;
  Rect *srcRect_local;
  Rect *dstRect_local;
  Bitmap *image_local;
  Canvas *this_local;
  
  local_50._0_4_ = dstRect->w / srcRect->w;
  matrix.b = dstRect->h / srcRect->h;
  local_50._4_4_ = 0.0;
  matrix.a = 0.0;
  matrix.c = -srcRect->x * (float)local_50._0_4_;
  matrix.d = -srcRect->y * matrix.b;
  matrix.e = matrix.b;
  matrix.f = (float)local_50._0_4_;
  plutovg_canvas_reset_matrix(this->m_canvas);
  plutovg_canvas_translate(this->m_canvas,(float)-this->m_x,(float)-this->m_y);
  ppVar1 = this->m_canvas;
  matrix_00 = Transform::matrix(transform);
  plutovg_canvas_transform(ppVar1,matrix_00);
  plutovg_canvas_translate(this->m_canvas,dstRect->x,dstRect->y);
  plutovg_canvas_set_fill_rule(this->m_canvas,PLUTOVG_FILL_RULE_NON_ZERO);
  plutovg_canvas_set_operator(this->m_canvas,PLUTOVG_OPERATOR_SRC_OVER);
  ppVar1 = this->m_canvas;
  surface = Bitmap::surface(image);
  plutovg_canvas_set_texture
            (ppVar1,surface,PLUTOVG_TEXTURE_TYPE_PLAIN,1.0,(plutovg_matrix_t *)local_50);
  plutovg_canvas_fill_rect(this->m_canvas,0.0,0.0,dstRect->w,dstRect->h);
  return;
}

Assistant:

void Canvas::drawImage(const Bitmap& image, const Rect& dstRect, const Rect& srcRect, const Transform& transform)
{
    auto xScale = dstRect.w / srcRect.w;
    auto yScale = dstRect.h / srcRect.h;
    plutovg_matrix_t matrix = { xScale, 0, 0, yScale, -srcRect.x * xScale, -srcRect.y * yScale };
    plutovg_canvas_reset_matrix(m_canvas);
    plutovg_canvas_translate(m_canvas, -m_x, -m_y);
    plutovg_canvas_transform(m_canvas, &transform.matrix());
    plutovg_canvas_translate(m_canvas, dstRect.x, dstRect.y);
    plutovg_canvas_set_fill_rule(m_canvas, PLUTOVG_FILL_RULE_NON_ZERO);
    plutovg_canvas_set_operator(m_canvas, PLUTOVG_OPERATOR_SRC_OVER);
    plutovg_canvas_set_texture(m_canvas, image.surface(), PLUTOVG_TEXTURE_TYPE_PLAIN, 1.f, &matrix);
    plutovg_canvas_fill_rect(m_canvas, 0, 0, dstRect.w, dstRect.h);
}